

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalNinjaGenerator::AppendCustomCommandLines
          (cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  string sStack_218;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1f8;
  cmOutputConverter *local_1f0;
  string wd;
  string cdStr;
  string launcher;
  
  uVar1 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
  if (uVar1 != 0) {
    cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&wd,ccg);
    if (wd._M_string_length == 0) {
      cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
      std::__cxx11::string::assign((char *)&wd);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&launcher);
    std::__cxx11::string::string((string *)&cdStr,"cd ",(allocator *)&sStack_218);
    poVar3 = std::operator<<((ostream *)&launcher,(string *)&cdStr);
    cmOutputConverter::ConvertToOutputFormat
              (&sStack_218,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               &wd,SHELL);
    std::operator<<(poVar3,(string *)&sStack_218);
    std::__cxx11::string::~string((string *)&sStack_218);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)cmdLines,
               &sStack_218);
    std::__cxx11::string::~string((string *)&sStack_218);
    std::__cxx11::string::~string((string *)&cdStr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&launcher);
    std::__cxx11::string::~string((string *)&wd);
  }
  local_1f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)cmdLines;
  MakeCustomLauncher_abi_cxx11_(&launcher,this,ccg);
  this_00 = local_1f8;
  local_1f0 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  uVar1 = 0;
  while( true ) {
    uVar2 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    if (uVar1 == uVar2) break;
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&sStack_218,ccg,uVar1);
    cmOutputConverter::ConvertToOutputFormat(&cdStr,local_1f0,&sStack_218,SHELL);
    std::operator+(&wd,&launcher,&cdStr);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,&wd);
    std::__cxx11::string::~string((string *)&wd);
    std::__cxx11::string::~string((string *)&cdStr);
    std::__cxx11::string::~string((string *)&sStack_218);
    cmCustomCommandGenerator::AppendArguments(ccg,uVar1,(string *)(*(long *)(this_00 + 8) + -0x20));
    uVar1 = uVar1 + 1;
  }
  std::__cxx11::string::~string((string *)&launcher);
  return;
}

Assistant:

void cmLocalNinjaGenerator::AppendCustomCommandLines(
  cmCustomCommandGenerator const& ccg,
  std::vector<std::string> &cmdLines)
{
  if (ccg.GetNumberOfCommands() > 0) {
    std::string wd = ccg.GetWorkingDirectory();
    if (wd.empty())
      wd = this->GetCurrentBinaryDirectory();

    std::ostringstream cdCmd;
#ifdef _WIN32
        std::string cdStr = "cd /D ";
#else
        std::string cdStr = "cd ";
#endif
    cdCmd << cdStr << this->ConvertToOutputFormat(wd, SHELL);
    cmdLines.push_back(cdCmd.str());
  }

  std::string launcher = this->MakeCustomLauncher(ccg);

  for (unsigned i = 0; i != ccg.GetNumberOfCommands(); ++i) {
    cmdLines.push_back(launcher +
      this->ConvertToOutputFormat(ccg.GetCommand(i), SHELL));

    std::string& cmd = cmdLines.back();
    ccg.AppendArguments(i, cmd);
  }
}